

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

ostream * argparse::operator<<(ostream *stream,Argument *argument)

{
  Argument *pAVar1;
  ostream *poVar2;
  string local_200 [32];
  undefined1 local_1e0 [32];
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  stringstream local_1a0 [8];
  stringstream nameStream;
  ostream_type local_190 [376];
  Argument *local_18;
  Argument *argument_local;
  ostream *stream_local;
  
  local_18 = argument;
  argument_local = (Argument *)stream;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 (&local_18->mNames);
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&local_18->mNames);
  std::
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  ::ostream_iterator(&local_1c0,local_190," ");
  std::
  copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             local_1a8,
             (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
              *)local_1b0);
  pAVar1 = argument_local;
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)pAVar1,local_200);
  poVar2 = std::operator<<(poVar2,"\t");
  std::operator<<(poVar2,(string *)&local_18->mHelp);
  std::__cxx11::string::~string(local_200);
  if (((byte)local_18->field_0xbc >> 1 & 1) != 0) {
    std::operator<<((ostream *)argument_local,"[Required]");
  }
  std::operator<<((ostream *)argument_local,"\n");
  pAVar1 = argument_local;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return (ostream *)pAVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &stream,
                                  const Argument &argument) {
    std::stringstream nameStream;
    std::copy(std::begin(argument.mNames), std::end(argument.mNames),
              std::ostream_iterator<std::string>(nameStream, " "));
    stream << nameStream.str() << "\t" << argument.mHelp;
    if (argument.mIsRequired)
      stream << "[Required]";
    stream << "\n";
    return stream;
  }